

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

int on_frame_recv(nghttp2_session *session,nghttp2_frame *frame,void *userp)

{
  size_t *psVar1;
  dynbuf *s;
  uint8_t uVar2;
  int iVar3;
  uint32_t uVar4;
  CURLcode CVar5;
  CURLUcode CVar6;
  uint uVar7;
  CURLMcode CVar8;
  Curl_easy *pCVar9;
  size_t sVar10;
  char *pcVar11;
  CURL_conflict *pCVar12;
  HTTP *pHVar13;
  CURLU *u;
  char *pcVar14;
  ulong uVar15;
  bool bVar16;
  curl_pushheaders heads;
  CURL_conflict *local_60;
  CURLUcode local_54;
  Curl_easy *local_50;
  Curl_easy *local_48;
  curl_pushheaders local_40;
  
  iVar3 = (frame->hd).stream_id;
  if (iVar3 == 0) {
    if ((frame->hd).type != '\x04') {
      return 0;
    }
    pCVar9 = *(Curl_easy **)((long)userp + 0x4a0);
    iVar3 = *(int *)((long)userp + 0x4e8);
    uVar4 = nghttp2_session_get_remote_settings(session,NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS);
    *(uint32_t *)((long)userp + 0x4e8) = uVar4;
    uVar4 = nghttp2_session_get_remote_settings(session,NGHTTP2_SETTINGS_ENABLE_PUSH);
    *(bool *)((long)userp + 0x4ec) = uVar4 != 0;
    if (iVar3 != *(int *)((long)userp + 0x4e8)) {
      Curl_infof(pCVar9,"Connection state changed (MAX_CONCURRENT_STREAMS == %u)!");
      pCVar9->multi->recheckstate = true;
      return 0;
    }
    return 0;
  }
  pCVar9 = (Curl_easy *)nghttp2_session_get_stream_user_data(session,iVar3);
  if (pCVar9 == (Curl_easy *)0x0) {
    return 0;
  }
  pHVar13 = (pCVar9->req).p.http;
  if (pHVar13 == (HTTP *)0x0) {
    return -0x386;
  }
  uVar2 = (frame->hd).type;
  if (uVar2 != '\x05') {
    if (uVar2 == '\x01') {
      if (pHVar13->bodystarted != false) {
        return 0;
      }
      if (pHVar13->status_code != -1) {
        if (99 < pHVar13->status_code - 100U) {
          pHVar13->bodystarted = true;
          pHVar13->status_code = -1;
        }
        s = &pHVar13->header_recvbuf;
        CVar5 = Curl_dyn_addn(s,"\r\n",2);
        if (CVar5 == CURLE_OK) {
          sVar10 = Curl_dyn_len(s);
          uVar15 = sVar10 - pHVar13->nread_header_recvbuf;
          pcVar14 = pHVar13->mem;
          if (pHVar13->len < uVar15) {
            uVar15 = pHVar13->len;
          }
          sVar10 = pHVar13->memlen;
          pcVar11 = Curl_dyn_ptr(s);
          memcpy(pcVar14 + sVar10,pcVar11 + pHVar13->nread_header_recvbuf,uVar15);
          pHVar13->nread_header_recvbuf = pHVar13->nread_header_recvbuf + uVar15;
          pHVar13->len = pHVar13->len - uVar15;
          pHVar13->memlen = pHVar13->memlen + uVar15;
          psVar1 = &(pCVar9->state).drain;
          *psVar1 = *psVar1 + 1;
          *(long *)((long)userp + 0x4e0) = *(long *)((long)userp + 0x4e0) + 1;
          if (*(Curl_easy **)((long)userp + 0x4a0) == pCVar9) {
            return 0;
          }
          Curl_expire(pCVar9,0,EXPIRE_RUN_NOW);
          return 0;
        }
        return -0x386;
      }
      return -0x386;
    }
    if (uVar2 != '\0') {
      return 0;
    }
    if (pHVar13->bodystarted != false) {
      return 0;
    }
    iVar3 = nghttp2_submit_rst_stream(session,'\0',iVar3,1);
    iVar3 = nghttp2_is_fatal(iVar3);
    goto LAB_00597b81;
  }
  if (pCVar9->multi->push_cb == (curl_push_callback)0x0) {
LAB_00597b60:
    bVar16 = false;
  }
  else {
    local_50 = pCVar9;
    pCVar12 = curl_easy_duphandle(pCVar9);
    local_48 = pCVar12;
    if (pCVar12 == (CURL_conflict *)0x0) {
LAB_00597a5c:
      bVar16 = false;
      Curl_infof(local_50,"failed to duplicate handle");
    }
    else {
      pHVar13 = (HTTP *)(*Curl_ccalloc)(1,0x2e8);
      if (pHVar13 == (HTTP *)0x0) {
        Curl_close(&local_48);
        local_60 = local_48;
        pCVar12 = local_48;
        if (local_48 == (CURL_conflict *)0x0) goto LAB_00597a5c;
      }
      else {
        (pCVar12->req).p.http = pHVar13;
        Curl_dyn_init(&pHVar13->header_recvbuf,0x20000);
        pHVar13 = (pCVar12->req).p.http;
        pHVar13->bodystarted = false;
        pHVar13->status_code = -1;
        pHVar13->closed = false;
        pHVar13->error = 0;
        pHVar13->pausedata = (uint8_t *)0x0;
        pHVar13->pauselen = 0;
        pHVar13->close_handled = false;
        pHVar13->mem = (char *)0x0;
        pHVar13->len = 0;
        pHVar13->memlen = 0;
        (pCVar12->state).stream_weight = (local_50->state).stream_weight;
      }
      local_40.data = local_50;
      pHVar13 = (local_50->req).p.http;
      local_60 = pCVar12;
      local_40.frame = (nghttp2_push_promise *)frame;
      if (pHVar13 != (HTTP *)0x0) {
        local_48 = (CURL_conflict *)0x0;
        u = curl_url();
        if (u != (CURLU *)0x0) {
          pcVar14 = curl_pushheader_byname(&local_40,":scheme");
          if ((((pcVar14 == (char *)0x0) ||
               (CVar6 = curl_url_set(u,CURLUPART_SCHEME,pcVar14,0), CVar6 == CURLUE_OK)) &&
              ((pcVar14 = curl_pushheader_byname(&local_40,":authority"), pcVar14 == (char *)0x0 ||
               (CVar6 = curl_url_set(u,CURLUPART_HOST,pcVar14,0), CVar6 == CURLUE_OK)))) &&
             ((pcVar14 = curl_pushheader_byname(&local_40,":path"), pcVar14 == (char *)0x0 ||
              (CVar6 = curl_url_set(u,CURLUPART_PATH,pcVar14,0), CVar6 == CURLUE_OK)))) {
            local_54 = curl_url_get(u,CURLUPART_URL,(char **)&local_48,0);
            curl_url_cleanup(u);
            if (local_54 == CURLUE_OK) {
              uVar7 = *(uint *)&(pCVar12->state).field_0x6d0;
              if ((uVar7 >> 0x11 & 1) != 0) {
                (*Curl_cfree)((pCVar12->state).url);
                uVar7 = *(uint *)&(pCVar12->state).field_0x6d0;
              }
              pCVar9 = local_50;
              *(uint *)&(pCVar12->state).field_0x6d0 = uVar7 | 0x20000;
              (pCVar12->state).url = (char *)local_48;
              Curl_set_in_callback(local_50,true);
              local_54 = (*pCVar9->multi->push_cb)
                                   (pCVar9,local_60,pHVar13->push_headers_used,&local_40,
                                    pCVar9->multi->push_userp);
              Curl_set_in_callback(pCVar9,false);
              if (pHVar13->push_headers_used != 0) {
                uVar15 = 0;
                do {
                  (*Curl_cfree)(pHVar13->push_headers[uVar15]);
                  uVar15 = uVar15 + 1;
                } while (uVar15 < pHVar13->push_headers_used);
              }
              (*Curl_cfree)(pHVar13->push_headers);
              pCVar9 = local_50;
              CVar6 = local_54;
              pHVar13->push_headers = (char **)0x0;
              pHVar13->push_headers_used = 0;
              pHVar13 = (local_60->req).p.http;
              if (local_54 == CURLUE_OK) {
                pHVar13->stream_id = (frame->push_promise).promised_stream_id;
                *(undefined4 *)&(local_60->req).size = 0xffffffff;
                *(undefined4 *)((long)&(local_60->req).size + 4) = 0xffffffff;
                *(undefined4 *)&(local_60->req).maxdownload = 0xffffffff;
                *(undefined4 *)((long)&(local_60->req).maxdownload + 4) = 0xffffffff;
                CVar8 = Curl_multi_add_perform(local_50->multi,local_60,(connectdata *)userp);
                if (CVar8 != CURLM_OK) {
                  Curl_infof(pCVar9,"failed to add handle to multi");
                  http2_stream_free((local_60->req).p.http);
                  (local_60->req).p.file = (FILEPROTO *)0x0;
                  goto LAB_00597bad;
                }
                iVar3 = nghttp2_session_set_stream_user_data
                                  (*(nghttp2_session **)((long)userp + 0x4a8),
                                   (frame->push_promise).promised_stream_id,local_60);
                if (iVar3 == 0) {
                  Curl_dyn_init(&pHVar13->header_recvbuf,0x20000);
                  Curl_dyn_init(&pHVar13->trailer_recvbuf,0x20000);
                  return 0;
                }
                bVar16 = false;
                Curl_infof(local_50,"failed to set user_data for stream %u",
                           (ulong)(uint)(frame->push_promise).promised_stream_id);
              }
              else {
                http2_stream_free(pHVar13);
                (local_60->req).p.file = (FILEPROTO *)0x0;
                Curl_close(&local_60);
                bVar16 = CVar6 == CURLUE_BAD_PARTPOINTER;
              }
              goto LAB_00597b62;
            }
          }
          else {
            curl_url_cleanup(u);
          }
        }
        Curl_close(&local_60);
        goto LAB_00597b60;
      }
      Curl_failf(local_50,"Internal NULL stream");
LAB_00597bad:
      bVar16 = false;
      Curl_close(&local_60);
    }
  }
LAB_00597b62:
  iVar3 = nghttp2_submit_rst_stream(session,'\0',(frame->push_promise).promised_stream_id,8);
  iVar3 = nghttp2_is_fatal(iVar3);
  if (bVar16) {
    return -0x386;
  }
LAB_00597b81:
  if (iVar3 == 0) {
    return 0;
  }
  return -0x386;
}

Assistant:

static int on_frame_recv(nghttp2_session *session, const nghttp2_frame *frame,
                         void *userp)
{
  struct connectdata *conn = (struct connectdata *)userp;
  struct http_conn *httpc = &conn->proto.httpc;
  struct Curl_easy *data_s = NULL;
  struct HTTP *stream = NULL;
  struct Curl_easy *data = get_transfer(httpc);
  int rv;
  size_t left, ncopy;
  int32_t stream_id = frame->hd.stream_id;
  CURLcode result;

  if(!stream_id) {
    /* stream ID zero is for connection-oriented stuff */
    if(frame->hd.type == NGHTTP2_SETTINGS) {
      uint32_t max_conn = httpc->settings.max_concurrent_streams;
      H2BUGF(infof(data, "Got SETTINGS"));
      httpc->settings.max_concurrent_streams =
        nghttp2_session_get_remote_settings(
          session, NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS);
      httpc->settings.enable_push =
        nghttp2_session_get_remote_settings(
          session, NGHTTP2_SETTINGS_ENABLE_PUSH);
      H2BUGF(infof(data, "MAX_CONCURRENT_STREAMS == %d",
                   httpc->settings.max_concurrent_streams));
      H2BUGF(infof(data, "ENABLE_PUSH == %s",
                   httpc->settings.enable_push?"TRUE":"false"));
      if(max_conn != httpc->settings.max_concurrent_streams) {
        /* only signal change if the value actually changed */
        infof(data,
              "Connection state changed (MAX_CONCURRENT_STREAMS == %u)!",
              httpc->settings.max_concurrent_streams);
        multi_connchanged(data->multi);
      }
    }
    return 0;
  }
  data_s = nghttp2_session_get_stream_user_data(session, stream_id);
  if(!data_s) {
    H2BUGF(infof(data,
                 "No Curl_easy associated with stream: %u",
                 stream_id));
    return 0;
  }

  stream = data_s->req.p.http;
  if(!stream) {
    H2BUGF(infof(data_s, "No proto pointer for stream: %u",
                 stream_id));
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  H2BUGF(infof(data_s, "on_frame_recv() header %x stream %u",
               frame->hd.type, stream_id));

  switch(frame->hd.type) {
  case NGHTTP2_DATA:
    /* If body started on this stream, then receiving DATA is illegal. */
    if(!stream->bodystarted) {
      rv = nghttp2_submit_rst_stream(session, NGHTTP2_FLAG_NONE,
                                     stream_id, NGHTTP2_PROTOCOL_ERROR);

      if(nghttp2_is_fatal(rv)) {
        return NGHTTP2_ERR_CALLBACK_FAILURE;
      }
    }
    break;
  case NGHTTP2_HEADERS:
    if(stream->bodystarted) {
      /* Only valid HEADERS after body started is trailer HEADERS.  We
         buffer them in on_header callback. */
      break;
    }

    /* nghttp2 guarantees that :status is received, and we store it to
       stream->status_code. Fuzzing has proven this can still be reached
       without status code having been set. */
    if(stream->status_code == -1)
      return NGHTTP2_ERR_CALLBACK_FAILURE;

    /* Only final status code signals the end of header */
    if(stream->status_code / 100 != 1) {
      stream->bodystarted = TRUE;
      stream->status_code = -1;
    }

    result = Curl_dyn_addn(&stream->header_recvbuf, STRCONST("\r\n"));
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;

    left = Curl_dyn_len(&stream->header_recvbuf) -
      stream->nread_header_recvbuf;
    ncopy = CURLMIN(stream->len, left);

    memcpy(&stream->mem[stream->memlen],
           Curl_dyn_ptr(&stream->header_recvbuf) +
           stream->nread_header_recvbuf,
           ncopy);
    stream->nread_header_recvbuf += ncopy;

    DEBUGASSERT(stream->mem);
    H2BUGF(infof(data_s, "Store %zu bytes headers from stream %u at %p",
                 ncopy, stream_id, stream->mem));

    stream->len -= ncopy;
    stream->memlen += ncopy;

    drain_this(data_s, httpc);
    /* if we receive data for another handle, wake that up */
    if(get_transfer(httpc) != data_s)
      Curl_expire(data_s, 0, EXPIRE_RUN_NOW);
    break;
  case NGHTTP2_PUSH_PROMISE:
    rv = push_promise(data_s, conn, &frame->push_promise);
    if(rv) { /* deny! */
      int h2;
      DEBUGASSERT((rv > CURL_PUSH_OK) && (rv <= CURL_PUSH_ERROROUT));
      h2 = nghttp2_submit_rst_stream(session, NGHTTP2_FLAG_NONE,
                                     frame->push_promise.promised_stream_id,
                                     NGHTTP2_CANCEL);
      if(nghttp2_is_fatal(h2))
        return NGHTTP2_ERR_CALLBACK_FAILURE;
      else if(rv == CURL_PUSH_ERROROUT) {
        DEBUGF(infof(data_s, "Fail the parent stream (too)"));
        return NGHTTP2_ERR_CALLBACK_FAILURE;
      }
    }
    break;
  default:
    H2BUGF(infof(data_s, "Got frame type %x for stream %u",
                 frame->hd.type, stream_id));
    break;
  }
  return 0;
}